

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_FailSet_Test::TestBody(TApp_FailSet_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  long lVar3;
  initializer_list<int> __l;
  int choice;
  AssertHelper AStack_118;
  allocator_type local_109;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined4 local_100;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [4];
  int local_a4;
  string local_a0;
  string local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-q,--quick","");
  local_108.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000001;
  local_100 = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_108;
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,__l,
             (less<int> *)&AStack_118,&local_109);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  this_00 = &(this->super_TApp).app;
  CLI::App::add_set<int>
            (this_00,&local_80,&local_a4,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60
             ,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  CLI::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_108.ptr_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"--quick","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"3","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"--quick=2","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_108,
             local_a8);
  lVar3 = 0;
  do {
    if (local_b8 + lVar3 != *(undefined1 **)((long)local_c8 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_c8 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x60);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_108);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_118,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x364,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_108);
  testing::internal::AssertHelper::~AssertHelper(&AStack_118);
  if (local_108.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_108.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108.ptr_ + 8))();
    }
    local_108.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_108.ptr_ = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"--quick=hello","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_108,
             local_e8);
  if (local_108.ptr_ != local_f8) {
    operator_delete(local_108.ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_108);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_118,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x369,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_108);
  testing::internal::AssertHelper::~AssertHelper(&AStack_118);
  if (((local_108.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_108.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_108.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, FailSet) {

    int choice;
    app.add_set("-q,--quick", choice, {1, 2, 3});

    args = {"--quick", "3", "--quick=2"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"--quick=hello"};
    EXPECT_THROW(run(), CLI::ConversionError);
}